

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

TValue * cpcall(lua_State *L,lua_CFunction func,void *ud)

{
  TValue *pTVar1;
  GCfunc *pGVar2;
  void *pvVar3;
  lua_State *in_RDX;
  lua_CFunction in_RSI;
  lua_State *in_RDI;
  TValue *top;
  GCfunc *fn;
  GCtab *in_stack_ffffffffffffff60;
  TValue *pTVar4;
  undefined8 in_stack_ffffffffffffff68;
  MSize nelems;
  void *in_stack_ffffffffffffffa0;
  lua_State *in_stack_ffffffffffffffa8;
  
  nelems = (MSize)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  getcurrenv(in_RDI);
  pGVar2 = lj_func_newC(in_RDX,nelems,in_stack_ffffffffffffff60);
  pTVar1 = in_RDI->top;
  (pGVar2->c).f = in_RSI;
  pTVar4 = pTVar1 + 1;
  (pTVar1->u32).lo = (uint32_t)pGVar2;
  (pTVar1->field_2).it = 0xfffffff7;
  pvVar3 = lj_lightud_intern(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pTVar4->u64 = (ulong)pvVar3 | 0xffff000000000000;
  *(undefined4 *)((long)in_RDI->cframe + 0x10) = 1;
  in_RDI->top = pTVar4 + 1;
  return pTVar4;
}

Assistant:

static TValue *cpcall(lua_State *L, lua_CFunction func, void *ud)
{
  GCfunc *fn = lj_func_newC(L, 0, getcurrenv(L));
  TValue *top = L->top;
  fn->c.f = func;
  setfuncV(L, top++, fn);
  if (LJ_FR2) setnilV(top++);
#if LJ_64
  ud = lj_lightud_intern(L, ud);
#endif
  setrawlightudV(top++, ud);
  cframe_nres(L->cframe) = 1+0;  /* Zero results. */
  L->top = top;
  return top-1;  /* Now call the newly allocated C function. */
}